

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack9_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  uVar2 = *(ulong *)in;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar2;
  auVar3 = vpinsrd_avx(auVar6,(uint)(uVar2 >> 9) & 0x7fffff,1);
  auVar7._8_4_ = 0x1ff;
  auVar7._0_8_ = 0x1ff000001ff;
  auVar7._12_4_ = 0x1ff;
  auVar3 = vpand_avx(auVar3,auVar7);
  *(long *)out = auVar3._0_8_;
  uVar1 = in[2];
  uVar5 = (uint)(uVar2 >> 0x20);
  out[2] = (uint)uVar2 >> 0x12 & 0x1ff;
  auVar3 = vpshufd_avx(auVar6,0x54);
  auVar4 = vpsrlvd_avx2(auVar3,_DAT_001a1ef0);
  auVar3 = vpinsrd_avx(auVar7,(uVar5 & 0xf) << 5,0);
  auVar6 = vpor_avx(auVar4,auVar3);
  auVar3 = vpand_avx(auVar4,auVar7);
  auVar3 = vpblendd_avx2(auVar3,auVar6,1);
  *(undefined1 (*) [16])(out + 3) = auVar3;
  out[7] = uVar5 >> 0x1f;
  out[7] = (uVar1 & 0xff) << 1 | uVar5 >> 0x1f;
  return in + 3;
}

Assistant:

const uint32_t *__fastunpack9_8(const uint32_t *__restrict__ in,
                                uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 9);
  out++;
  *out = ((*in) >> 9) % (1U << 9);
  out++;
  *out = ((*in) >> 18) % (1U << 9);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 4)) << (9 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 9);
  out++;
  *out = ((*in) >> 13) % (1U << 9);
  out++;
  *out = ((*in) >> 22) % (1U << 9);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 8)) << (9 - 8);
  out++;

  return in + 1;
}